

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void parse_cache(vw *all,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *cache_files,bool kill_cache,bool quiet)

{
  undefined8 *puVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  char *pcVar5;
  size_type sVar6;
  ostream *poVar7;
  byte in_CL;
  byte in_DL;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  long in_RDI;
  uint64_t c;
  exception *anon_var_0;
  int f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool in_stack_000000a7;
  string *in_stack_000000a8;
  vw *in_stack_000000b0;
  int in_stack_000006e4;
  io_buf *in_stack_000006e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  v_array<char> *in_stack_ffffffffffffff80;
  int local_3c;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28 [2];
  byte local_12;
  byte local_11;
  long local_8;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  *(undefined1 *)(*(long *)(in_RDI + 8) + 0x210) = 0;
  local_8 = in_RDI;
  local_28[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffff78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(in_stack_ffffffffffffff78);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffff80,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffff78), bVar2) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(local_28);
    local_3c = -1;
    if ((local_11 & 1) == 0) {
      puVar1 = *(undefined8 **)(*(long *)(local_8 + 8) + 0x1e8);
      uVar4 = std::__cxx11::string::c_str();
      local_3c = (**(code **)*puVar1)(puVar1,uVar4,*(byte *)(local_8 + 0x3558) & 1,1);
    }
    if (local_3c == -1) {
      make_write_cache(in_stack_000000b0,in_stack_000000a8,in_stack_000000a7);
    }
    else {
      uVar3 = cache_numbits(in_stack_000006e8,in_stack_000006e4);
      if (uVar3 < *(uint *)(local_8 + 0x50)) {
        if ((local_12 & 1) == 0) {
          poVar7 = std::operator<<((ostream *)(local_8 + 0xe0),
                                   "WARNING: cache file is ignored as it\'s made with less bit precision than required!"
                                  );
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        (**(code **)(**(long **)(*(long *)(local_8 + 8) + 0x1e8) + 0x40))();
        make_write_cache(in_stack_000000b0,in_stack_000000a8,in_stack_000000a7);
      }
      else {
        if ((local_12 & 1) == 0) {
          in_stack_ffffffffffffff80 =
               (v_array<char> *)std::operator<<((ostream *)(local_8 + 0xe0),"using cache_file = ");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          poVar7 = std::operator<<((ostream *)in_stack_ffffffffffffff80,pcVar5);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        *(code **)(*(long *)(local_8 + 8) + 0x1f0) = read_cached_features;
        if (uVar3 == *(uint32_t *)(local_8 + 0x50)) {
          *(undefined1 *)(*(long *)(local_8 + 8) + 0x212) = 1;
        }
        else {
          *(undefined1 *)(*(long *)(local_8 + 8) + 0x212) = 0;
        }
        *(undefined1 *)(*(long *)(local_8 + 8) + 0x200) = 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(local_28);
  }
  *(long *)(local_8 + 0x358) = (1L << ((byte)*(undefined4 *)(local_8 + 0x50) & 0x3f)) + -1;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RSI);
  if (sVar6 == 0) {
    if ((local_12 & 1) == 0) {
      poVar7 = std::operator<<((ostream *)(local_8 + 0xe0),"using no cache");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    v_array<char>::delete_v(in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void parse_cache(vw& all, std::vector<std::string> cache_files, bool kill_cache, bool quiet)
{
  all.p->write_cache = false;

  for (auto& file : cache_files)
  {
    int f = -1;
    if (!kill_cache)
      try
      {
        f = all.p->input->open_file(file.c_str(), all.stdin_off, io_buf::READ);
      }
      catch (const exception&)
      {
        f = -1;
      }
    if (f == -1)
      make_write_cache(all, file, quiet);
    else
    {
      uint64_t c = cache_numbits(all.p->input, f);
      if (c < all.num_bits)
      {
        if (!quiet)
          all.trace_message << "WARNING: cache file is ignored as it's made with less bit precision than required!"
                            << endl;
        all.p->input->close_file();
        make_write_cache(all, file, quiet);
      }
      else
      {
        if (!quiet)
          all.trace_message << "using cache_file = " << file.c_str() << endl;
        all.p->reader = read_cached_features;
        if (c == all.num_bits)
          all.p->sorted_cache = true;
        else
          all.p->sorted_cache = false;
        all.p->resettable = true;
      }
    }
  }

  all.parse_mask = ((uint64_t)1 << all.num_bits) - 1;
  if (cache_files.size() == 0)
  {
    if (!quiet)
      all.trace_message << "using no cache" << endl;
    all.p->output->space.delete_v();
  }
}